

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O2

void __thiscall check_dimension::test_method(check_dimension *this)

{
  long lVar1;
  undefined8 *puVar2;
  Bitmap_cubical_complex *pBVar3;
  initializer_list<double> __l;
  initializer_list<unsigned_int> __l_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dimensions;
  vector<double,_std::allocator<double>_> increasingFiltrationOfTopDimensionalCells;
  shared_count sStack_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined8 *local_e0;
  char **local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  Bitmap_cubical_complex increasing;
  
  puVar2 = &DAT_00119e38;
  pBVar3 = &increasing;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pBVar3->super_Bitmap_cubical_complex_base<double>)._vptr_Bitmap_cubical_complex_base =
         (_func_int **)*puVar2;
    puVar2 = puVar2 + 1;
    pBVar3 = (Bitmap_cubical_complex *)&(pBVar3->super_Bitmap_cubical_complex_base<double>).sizes;
  }
  __l._M_len = 9;
  __l._M_array = (iterator)&increasing;
  std::vector<double,_std::allocator<double>_>::vector
            (&increasingFiltrationOfTopDimensionalCells,__l,(allocator_type *)&local_f0);
  increasing.super_Bitmap_cubical_complex_base<double>._vptr_Bitmap_cubical_complex_base =
       (_func_int **)0x300000003;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&increasing;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&dimensions,__l_00,(allocator_type *)&local_f0);
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  Bitmap_cubical_complex(&increasing,&dimensions,&increasingFiltrationOfTopDimensionalCells,true);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x27);
  sStack_f8.pi_ = (sp_counted_base *)0x0;
  local_d8 = &local_c0;
  local_c0 = "increasing.dimension() == 2";
  local_b8 = "";
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_00122ba8;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
  ;
  local_c8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f8);
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  ~Bitmap_cubical_complex(&increasing);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dimensions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&increasingFiltrationOfTopDimensionalCells.
              super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_dimension) {
  std::vector<double> increasingFiltrationOfTopDimensionalCells({1, 2, 3, 4, 5, 6, 7, 8, 9});

  std::vector<unsigned> dimensions({3, 3});

  Bitmap_cubical_complex increasing(dimensions, increasingFiltrationOfTopDimensionalCells);
  BOOST_CHECK(increasing.dimension() == 2);
}